

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O3

yajl_status yajl_parse(yajl_handle hand,uchar *jsonText,size_t jsonTextLen)

{
  yajl_status yVar1;
  yajl_lexer pyVar2;
  
  if (hand->lexer == (yajl_lexer)0x0) {
    pyVar2 = yajl_lex_alloc(&hand->alloc,hand->flags & 1,(uint)((hand->flags & 2) == 0));
    hand->lexer = pyVar2;
  }
  yVar1 = yajl_do_parse(hand,jsonText,jsonTextLen);
  return yVar1;
}

Assistant:

yajl_status
yajl_parse(yajl_handle hand, const unsigned char * jsonText,
           size_t jsonTextLen)
{
    yajl_status status;

    /* lazy allocation of the lexer */
    if (hand->lexer == NULL) {
        hand->lexer = yajl_lex_alloc(&(hand->alloc),
                                     hand->flags & yajl_allow_comments,
                                     !(hand->flags & yajl_dont_validate_strings));
    }

    status = yajl_do_parse(hand, jsonText, jsonTextLen);
    return status;
}